

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode
JsGetModuleHostInfo(JsModuleRecord requestModule,JsModuleHostInfoKind moduleHostInfo,void **hostInfo
                   )

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  SourceTextModuleRecord *pSVar3;
  JsrtContext *pJVar4;
  JsrtContext *context;
  void *pvVar5;
  undefined4 *puVar6;
  JsErrorCode JVar7;
  Type *pTVar8;
  void *unaff_retaddr;
  undefined1 local_a0 [8];
  EnterScriptObject __enterScriptObject;
  TTDebuggerAbortException anon_var_0;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if ((requestModule == (JsModuleRecord)0x0) ||
     (bVar2 = true, *(int *)((long)requestModule + 8) != 0x65646f4d)) {
    bVar2 = false;
  }
  if (!bVar2 || hostInfo == (void **)0x0) {
    return JsErrorInvalidArgument;
  }
  *hostInfo = (void *)0x0;
  pSVar3 = Js::SourceTextModuleRecord::FromHost(requestModule);
  pJVar4 = (JsrtContext *)
           Js::JavascriptLibrary::GetJsrtContext
                     ((((pSVar3->scriptContext).ptr)->super_ScriptContextBase).javascriptLibrary);
  context = JsrtContext::GetCurrent();
  scriptContext = (((pJVar4->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_34,ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                      ExceptionType_OutOfMemory);
  bVar2 = JsrtContext::TrySetCurrent(pJVar4);
  JVar7 = JsErrorWrongThread;
  if (!bVar2) goto LAB_003c28f0;
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_a0,scriptContext,
             (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,&stack0x00000000,
             true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_a0);
  pJVar4 = JsrtContext::GetCurrent();
  switch(moduleHostInfo) {
  case JsModuleHostInfo_Exception:
    pvVar5 = (pSVar3->errorObject).ptr;
    if (pvVar5 != (void *)0x0) goto LAB_003c28df;
    goto LAB_003c28e2;
  case JsModuleHostInfo_HostDefined:
    pTVar8 = &pSVar3->hostDefined;
    break;
  case JsModuleHostInfo_NotifyModuleReadyCallback:
    pTVar8 = (Type *)(pJVar4[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject + 4);
    break;
  case JsModuleHostInfo_FetchImportedModuleCallback:
    pTVar8 = (Type *)(pJVar4[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject + 2);
    break;
  case JsModuleHostInfo_FetchImportedModuleFromScriptCallback:
    pTVar8 = (Type *)(pJVar4[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject + 3);
    break;
  case JsModuleHostInfo_Url:
    pTVar8 = &pSVar3->normalizedSpecifier;
    break;
  case JsModuleHostInfo_InitializeImportMetaCallback:
    pTVar8 = (Type *)(pJVar4[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject + 5);
    break;
  case JsModuleHostInfo_ReportModuleCompletionCallback:
    pTVar8 = (Type *)(pJVar4[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject + 6);
    break;
  default:
    JVar7 = JsInvalidModuleHostInfoKind;
    goto LAB_003c28e4;
  }
  pvVar5 = pTVar8->ptr;
LAB_003c28df:
  *hostInfo = pvVar5;
LAB_003c28e2:
  JVar7 = JsNoError;
LAB_003c28e4:
  Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_a0);
LAB_003c28f0:
  if ((JVar7 - JsErrorNoCurrentContext < 7) &&
     ((0x43U >> (JVar7 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/../JsrtInternal.h"
                       ,0x171,
                       "(errorCode != JsErrorFatal && errorCode != JsErrorNoCurrentContext && errorCode != JsErrorInExceptionState && errorCode != JsErrorInDisabledState && errorCode != JsErrorOutOfMemory && errorCode != JsErrorScriptException && errorCode != JsErrorScriptTerminated)"
                       ,
                       "errorCode != JsErrorFatal && errorCode != JsErrorNoCurrentContext && errorCode != JsErrorInExceptionState && errorCode != JsErrorInDisabledState && errorCode != JsErrorOutOfMemory && errorCode != JsErrorScriptException && errorCode != JsErrorScriptTerminated"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)&__enterScriptObject.library,
             ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  JsrtContext::TrySetCurrent(context);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)&__enterScriptObject.library);
  return JVar7;
}

Assistant:

CHAKRA_API
JsGetModuleHostInfo(
    _In_  JsModuleRecord requestModule,
    _In_ JsModuleHostInfoKind moduleHostInfo,
    _Outptr_result_maybenull_ void** hostInfo)
{
    if (!Js::SourceTextModuleRecord::Is(requestModule) || (hostInfo == nullptr))
    {
        return JsErrorInvalidArgument;
    }
    *hostInfo = nullptr;
    Js::SourceTextModuleRecord* moduleRecord = Js::SourceTextModuleRecord::FromHost(requestModule);
    Js::ScriptContext* scriptContext = moduleRecord->GetScriptContext();
    JsrtContext* jsrtContext = (JsrtContext*)scriptContext->GetLibrary()->GetJsrtContext();
    JsErrorCode errorCode = SetContextAPIWrapper(jsrtContext, [&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        JsrtContextCore* currentContext = static_cast<JsrtContextCore*>(JsrtContextCore::GetCurrent());
        switch (moduleHostInfo)
        {
        case JsModuleHostInfo_Exception:
            if (moduleRecord->GetErrorObject() != nullptr)
            {
                *hostInfo = moduleRecord->GetErrorObject();
            }
            break;
        case JsModuleHostInfo_HostDefined:
            *hostInfo = moduleRecord->GetHostDefined();
            break;
        case JsModuleHostInfo_FetchImportedModuleCallback:
            *hostInfo = reinterpret_cast<void*>(currentContext->GetHostScriptContext()->GetFetchImportedModuleCallback());
            break;
        case JsModuleHostInfo_FetchImportedModuleFromScriptCallback:
            *hostInfo = reinterpret_cast<void*>(currentContext->GetHostScriptContext()->GetFetchImportedModuleFromScriptCallback());
            break;
        case JsModuleHostInfo_NotifyModuleReadyCallback:
            *hostInfo = reinterpret_cast<void*>(currentContext->GetHostScriptContext()->GetNotifyModuleReadyCallback());
            break;
        case JsModuleHostInfo_InitializeImportMetaCallback:
            *hostInfo = reinterpret_cast<void*>(currentContext->GetHostScriptContext()->GetInitializeImportMetaCallback());
            break;
        case JsModuleHostInfo_ReportModuleCompletionCallback:
            *hostInfo = reinterpret_cast<void*>(currentContext->GetHostScriptContext()->GetReportModuleCompletionCallback());
            break;
        case JsModuleHostInfo_Url:
            *hostInfo = reinterpret_cast<void*>(moduleRecord->GetSpecifier());
            break;
        default:
            return JsInvalidModuleHostInfoKind;
        };
        return JsNoError;
    });
    return errorCode;
}